

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> __thiscall
bssl::CreateCertErrorParams2SizeT(bssl *this,char *name1,size_t value1,char *name2,size_t value2)

{
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2SizeT,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2SizeT>_>
  local_38;
  size_t local_30;
  size_t value2_local;
  char *name2_local;
  size_t value1_local;
  char *name1_local;
  
  local_30 = value2;
  value2_local = (size_t)name2;
  name2_local = (char *)value1;
  value1_local = (size_t)name1;
  name1_local = (char *)this;
  if (name1 == (char *)0x0) {
    abort();
  }
  if (name2 == (char *)0x0) {
    abort();
  }
  ::std::
  make_unique<bssl::(anonymous_namespace)::CertErrorParams2SizeT,char_const*&,unsigned_long&,char_const*&,unsigned_long&>
            ((char **)&local_38,&value1_local,&name2_local,&value2_local);
  ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2SizeT,std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2SizeT>,void>
            ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)this,
             &local_38);
  ::std::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2SizeT,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2SizeT>_>
  ::~unique_ptr(&local_38);
  return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
          )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )this;
}

Assistant:

OPENSSL_EXPORT std::unique_ptr<CertErrorParams> CreateCertErrorParams2SizeT(
    const char *name1, size_t value1, const char *name2, size_t value2) {
  BSSL_CHECK(name1);
  BSSL_CHECK(name2);
  return std::make_unique<CertErrorParams2SizeT>(name1, value1, name2, value2);
}